

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O2

void __thiscall Generator::addClassInfos(Generator *this)

{
  FILE *__stream;
  uint uVar1;
  uint uVar2;
  long lVar3;
  ClassInfoDef *c;
  ClassInfoDef *s;
  
  s = (this->cdef->super_BaseDef).classInfoList.d.ptr;
  for (lVar3 = (this->cdef->super_BaseDef).classInfoList.d.size * 0x30; lVar3 != 0;
      lVar3 = lVar3 + -0x30) {
    __stream = (FILE *)this->out;
    uVar1 = stridx(this,&s->name);
    uVar2 = stridx(this,&s->value);
    fprintf(__stream,"            { %4d, %4d },\n",(ulong)uVar1,(ulong)uVar2);
    s = s + 1;
  }
  return;
}

Assistant:

void Generator::addClassInfos()
{
    for (const ClassInfoDef &c : std::as_const(cdef->classInfoList))
        fprintf(out, "            { %4d, %4d },\n", stridx(c.name), stridx(c.value));
}